

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int lws_system_smd_cb(void *opaque,lws_smd_class_t _class,lws_usec_t timestamp,void *buf,size_t len)

{
  int iVar1;
  lws_context *cx;
  size_t len_local;
  void *buf_local;
  lws_usec_t timestamp_local;
  lws_smd_class_t _class_local;
  void *opaque_local;
  
  if (_class == 4) {
    iVar1 = lws_json_simple_strcmp((char *)buf,len,"\"trigger\":","cpdcheck");
    if (iVar1 == 0) {
      lws_system_cpd_start((lws_context *)opaque);
    }
    else {
      iVar1 = lws_json_simple_strcmp((char *)buf,len,"\"type\":","ipacq");
      if (iVar1 == 0) {
        lws_system_cpd_start((lws_context *)opaque);
      }
    }
  }
  return 0;
}

Assistant:

static int
lws_system_smd_cb(void *opaque, lws_smd_class_t _class, lws_usec_t timestamp,
		  void *buf, size_t len)
{
	struct lws_context *cx = (struct lws_context *)opaque;

	if (_class != LWSSMDCL_NETWORK)
		return 0;

	/* something external requested CPD check */

	if (!lws_json_simple_strcmp(buf, len, "\"trigger\":", "cpdcheck"))
		lws_system_cpd_start(cx);
	else
		/*
		 * IP acquisition on any interface triggers captive portal
		 * check on default route
		 */
		if (!lws_json_simple_strcmp(buf, len, "\"type\":", "ipacq"))
			lws_system_cpd_start(cx);

#if defined(LWS_WITH_SYS_NTPCLIENT)
	/*
	 * Captive portal detect showing internet workable triggers NTP Client
	 */
	if (!lws_json_simple_strcmp(buf, len, "\"type\":", "cps") &&
	    !lws_json_simple_strcmp(buf, len, "\"result\":", "OK") &&
	    lws_now_secs() < 1594017754) /* 06:42 Mon Jul 6 2020 UTC */
		lws_ntpc_trigger(cx);
#endif

#if defined(LWS_WITH_SYS_DHCP_CLIENT) && 0
	/*
	 * Any network interface linkup triggers DHCP
	 */
	if (!lws_json_simple_strcmp(buf, len, "\"type\":", "linkup"))
		lws_ntpc_trigger(cx);

#endif

#if defined(LWS_WITH_DRIVERS) && defined(LWS_WITH_NETWORK)
	lws_netdev_smd_cb(opaque, _class, timestamp, buf, len);
#endif

	return 0;
}